

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkShapes.cpp
# Opt level: O0

void __thiscall
CoreML::NeuralNetworkShaper::shapeLoadConstantLayer
          (NeuralNetworkShaper *this,NeuralNetworkLayer *specLayer)

{
  undefined8 uVar1;
  string *psVar2;
  mapped_type *this_00;
  LoadConstantLayerParams *from;
  uint64_t uVar3;
  undefined1 local_58 [8];
  LoadConstantLayerParams load_constant;
  ShapeConstraint *outputShape;
  NeuralNetworkLayer *specLayer_local;
  NeuralNetworkShaper *this_local;
  
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  this_00 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::ShapeConstraint>_>_>
            ::operator[](&this->blobShapes,psVar2);
  load_constant._48_8_ = this_00;
  psVar2 = Specification::NeuralNetworkLayer::output_abi_cxx11_(specLayer,0);
  ShapeConstraint::setName(this_00,psVar2);
  from = Specification::NeuralNetworkLayer::loadconstant(specLayer);
  Specification::LoadConstantLayerParams::LoadConstantLayerParams
            ((LoadConstantLayerParams *)local_58,from);
  ShapeConstraint::setSequence((ShapeConstraint *)load_constant._48_8_,1);
  ShapeConstraint::setBatch((ShapeConstraint *)load_constant._48_8_,1);
  uVar1 = load_constant._48_8_;
  uVar3 = Specification::LoadConstantLayerParams::shape((LoadConstantLayerParams *)local_58,0);
  ShapeConstraint::setChannel((ShapeConstraint *)uVar1,uVar3);
  uVar1 = load_constant._48_8_;
  uVar3 = Specification::LoadConstantLayerParams::shape((LoadConstantLayerParams *)local_58,1);
  ShapeConstraint::setHeight((ShapeConstraint *)uVar1,uVar3);
  uVar1 = load_constant._48_8_;
  uVar3 = Specification::LoadConstantLayerParams::shape((LoadConstantLayerParams *)local_58,2);
  ShapeConstraint::setWidth((ShapeConstraint *)uVar1,uVar3);
  Specification::LoadConstantLayerParams::~LoadConstantLayerParams
            ((LoadConstantLayerParams *)local_58);
  return;
}

Assistant:

void NeuralNetworkShaper::shapeLoadConstantLayer(const Specification::NeuralNetworkLayer& specLayer) {

    //get the input shape
    ShapeConstraint& outputShape = blobShapes[specLayer.output(0)];
    outputShape.setName(specLayer.output(0));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Load Constant layer " << specLayer.name() << " output shapes (before): " << std::endl;
    std::cout << outputShape;
#endif

    Specification::LoadConstantLayerParams load_constant = specLayer.loadconstant();

    outputShape.setSequence(1);
    outputShape.setBatch(1);
    outputShape.setChannel((size_t)load_constant.shape(0));
    outputShape.setHeight((size_t)load_constant.shape(1));
    outputShape.setWidth((size_t)load_constant.shape(2));

#if COREML_VALIDATOR_VERBOSE
    std::cout << "Load Constant layer " << specLayer.name() << " output shapes (after): " << std::endl;
    std::cout << outputShape;
#endif

}